

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O2

void SVGChart::MakeExamplePlot7(PPlot *ioPPlot)

{
  vector<float,_std::allocator<float>_> *this;
  double dVar1;
  PPlot *pPVar2;
  PlotDataBase *inYData;
  LegendData *this_00;
  int theI;
  int iVar3;
  float fVar4;
  float local_50;
  float local_4c;
  double local_48;
  PlotDataBase *local_40;
  PPlot *local_38;
  
  local_38 = ioPPlot;
  local_40 = (PlotDataBase *)operator_new(0x20);
  this = (vector<float,_std::allocator<float>_> *)(local_40 + 1);
  local_40->_vptr_PlotDataBase = (_func_int **)0x0;
  local_40[1]._vptr_PlotDataBase = (_func_int **)0x0;
  local_40[2]._vptr_PlotDataBase = (_func_int **)0x0;
  local_40[3]._vptr_PlotDataBase = (_func_int **)0x0;
  local_40->_vptr_PlotDataBase = (_func_int **)&PTR__PlotData_00111c00;
  inYData = (PlotDataBase *)operator_new(0x20);
  inYData->_vptr_PlotDataBase = (_func_int **)0x0;
  inYData[1]._vptr_PlotDataBase = (_func_int **)0x0;
  inYData[2]._vptr_PlotDataBase = (_func_int **)0x0;
  inYData[3]._vptr_PlotDataBase = (_func_int **)0x0;
  inYData->_vptr_PlotDataBase = (_func_int **)&PTR__PlotData_00111c00;
  dVar1 = 0.0;
  for (iVar3 = 0; iVar3 != 0x65; iVar3 = iVar3 + 1) {
    local_4c = (float)(dVar1 * 0.001 + 0.0001);
    local_48 = dVar1;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(this,&local_4c);
    fVar4 = (float)iVar3;
    local_50 = fVar4 * 0.0001 * fVar4 * fVar4 + 0.01;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>
              ((vector<float,_std::allocator<float>_> *)(inYData + 1),&local_50);
    dVar1 = local_48 + 1.0;
  }
  this_00 = (LegendData *)operator_new(0xa8);
  LegendData::LegendData(this_00);
  std::__cxx11::string::assign((char *)this_00);
  pPVar2 = local_38;
  (this_00->mColor).mR = 'd';
  (this_00->mColor).mG = 'd';
  (this_00->mColor).mB = 200;
  PlotDataContainer::AddXYPlot
            (&local_38->mPlotDataContainer,local_40,inYData,this_00,(DataDrawerBase *)0x0,
             (PlotDataSelection *)0x0);
  (pPVar2->mYAxisSetup).mLogScale = true;
  (pPVar2->mYAxisSetup).mLogFactor = 0x14;
  (pPVar2->mMargins).mLeft = 0x32;
  (pPVar2->mMargins).mTop = 0x14;
  (pPVar2->mGridInfo).mXGridOn = true;
  (pPVar2->mGridInfo).mYGridOn = true;
  return;
}

Assistant:

void MakeExamplePlot7 (PPlot &ioPPlot) {

      PlotData *theX1 = new PlotData ();
      PlotData *theY1 = new PlotData ();
      float theFac = 100.0f/(100*100*100);
      for (int theI=0;theI<=100;theI++) {
        theX1->push_back (0.0001+theI*0.001);
        theY1->push_back (0.01+theFac*theI*theI*theI);
      }
      LegendData *theLegend = new LegendData ();
      theLegend->mName = "foo";
      theLegend->mColor = PColor (100,100,200);
      ioPPlot.mPlotDataContainer.AddXYPlot (theX1, theY1, theLegend);
      ioPPlot.mYAxisSetup.mLogScale = true;
      ioPPlot.mYAxisSetup.mLogFactor = 20;
      ioPPlot.mMargins.mLeft = 50;
      ioPPlot.mMargins.mTop = 20;

      ioPPlot.mGridInfo.mXGridOn = true;
      ioPPlot.mGridInfo.mYGridOn = true;
    }